

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O2

void * CharacterUnion::UnPack(void *obj,Character type,resolver_function_t *resolver)

{
  uint uVar1;
  AttackerT *pAVar2;
  string *psVar3;
  undefined7 in_register_00000031;
  String *ptr;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 1:
    pAVar2 = Attacker::UnPack((Attacker *)obj,resolver);
    return pAVar2;
  case 2:
  case 3:
  case 4:
    psVar3 = (string *)operator_new(4);
    *(undefined4 *)psVar3 = *obj;
    break;
  case 5:
    psVar3 = (string *)operator_new(0x20);
    uVar1 = *obj;
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar3,(long)obj + 4,(long)obj + (ulong)uVar1 + 4);
    break;
  case 6:
    psVar3 = (string *)operator_new(0x20);
    uVar1 = *obj;
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar3,(long)obj + 4,(long)obj + (ulong)uVar1 + 4);
    break;
  default:
    psVar3 = (string *)0x0;
  }
  return psVar3;
}

Assistant:

inline void *CharacterUnion::UnPack(const void *obj, Character type, const ::flatbuffers::resolver_function_t *resolver) {
  (void)resolver;
  switch (type) {
    case Character_MuLan: {
      auto ptr = reinterpret_cast<const Attacker *>(obj);
      return ptr->UnPack(resolver);
    }
    case Character_Rapunzel: {
      auto ptr = reinterpret_cast<const Rapunzel *>(obj);
      return new Rapunzel(*ptr);
    }
    case Character_Belle: {
      auto ptr = reinterpret_cast<const BookReader *>(obj);
      return new BookReader(*ptr);
    }
    case Character_BookFan: {
      auto ptr = reinterpret_cast<const BookReader *>(obj);
      return new BookReader(*ptr);
    }
    case Character_Other: {
      auto ptr = reinterpret_cast<const ::flatbuffers::String *>(obj);
      return new std::string(ptr->c_str(), ptr->size());
    }
    case Character_Unused: {
      auto ptr = reinterpret_cast<const ::flatbuffers::String *>(obj);
      return new std::string(ptr->c_str(), ptr->size());
    }
    default: return nullptr;
  }
}